

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqOutExecute(RqOutProgram *pcOutProgMem,size_t nSymSize,void *pcInterSymMem,void *pOutSymMem,
                size_t nOutSymMemSize)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  int j_1;
  int j;
  tuple T;
  int i;
  m256v I;
  m256v O;
  parameters *P;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  uint8_t alpha;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  int local_78;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int iVar1;
  m256v local_68;
  m256v local_50;
  long local_38;
  uint8_t *local_20;
  long local_18;
  long local_10;
  int local_4;
  
  if (in_R8 < (ulong)(*(int *)(in_RDI + 0x30) * in_RSI)) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x131,"Not enough space for generated symbols.");
    local_4 = -1;
  }
  else {
    local_38 = in_RDI;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    m256v_make(&local_50,*(int *)(in_RDI + 0x30),(int)in_RSI,in_RCX);
    m256v_make(&local_68,*(int *)(local_38 + 0xc),(int)local_18,local_20);
    for (iVar1 = 0; iVar1 < *(int *)(local_10 + 0x30); iVar1 = iVar1 + 1) {
      tuple_generate_from_ESI
                (in_stack_ffffffffffffff84,
                 (parameters *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      m256v_copy_row((m256v *)CONCAT44(iVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                     (m256v *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
      for (in_stack_ffffffffffffff78 = 1; alpha = (uint8_t)((uint)in_stack_ffffffffffffff78 >> 0x18)
          , in_stack_ffffffffffffff78 < in_stack_ffffffffffffff7c;
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1) {
        in_stack_ffffffffffffff84 =
             (int)(in_stack_ffffffffffffff84 + in_stack_ffffffffffffff80) %
             *(int *)(local_38 + 0x1c);
        m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,alpha,
                          (m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
      }
      for (; *(int *)(local_38 + 0x20) <= in_stack_ffffffffffffff90;
          in_stack_ffffffffffffff90 =
               (in_stack_ffffffffffffff90 + in_stack_ffffffffffffff8c) % *(int *)(local_38 + 0x24))
      {
      }
      m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c,alpha,
                        (m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
      for (in_stack_ffffffffffffff74 = 1; in_stack_ffffffffffffff74 < local_78;
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
        do {
          in_stack_ffffffffffffff90 =
               (in_stack_ffffffffffffff90 + in_stack_ffffffffffffff8c) % *(int *)(local_38 + 0x24);
        } while (*(int *)(local_38 + 0x20) <= in_stack_ffffffffffffff90);
        m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,
                          (uint8_t)((uint)in_stack_ffffffffffffff78 >> 0x18),
                          (m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int RqOutExecute(const RqOutProgram* pcOutProgMem,
		 size_t nSymSize,
		 const void* pcInterSymMem,
		 void* pOutSymMem,
		 size_t nOutSymMemSize)
{
	/* Check memory limitations */
	if (nOutSymMemSize < pcOutProgMem->nESI * nSymSize) {
		errmsg("Not enough space for generated symbols.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	const parameters* P = &pcOutProgMem->params;
	m256v O = m256v_make(pcOutProgMem->nESI, nSymSize, pOutSymMem);
	m256v I = m256v_make(P->L, nSymSize, (void*)pcInterSymMem);

	/* Generate symbols */
	for (int i = 0; i < pcOutProgMem->nESI; ++i) {
		// Sect 5.3.5.3
		tuple T = tuple_generate_from_ESI(
				pcOutProgMem->ESIs[i], P);
		m256v_copy_row(&I, T.b, &O, i);
		for (int j = 1; j < T.d; ++j) {
			T.b = (T.b + T.a) % P->W;
			m256v_multadd_row(&I, T.b, 1, &O, i);
		}
		while (T.b1 >= P->P)
			T.b1 = (T.b1 + T.a1) % P->P1;
		m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		for (int j = 1; j < T.d1; ++j) {
			do {
				T.b1 = (T.b1 + T.a1) % P->P1;
			} while(T.b1 >= P->P);
			m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		}
	}

	return 0;
}